

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void fmt::v7::detail::vformat_to<char>
               (buffer<char> *buf,text_style *ts,basic_string_view<char> format_str,
               basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               args)

{
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_string_view<char> format_str_00;
  emphasis em;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  locale_ref local_b0;
  unsigned_long_long local_a8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_a0;
  char *local_98;
  size_t local_90;
  color_type local_88;
  undefined1 local_80 [8];
  ansi_color_escape<char> background;
  undefined1 local_61 [8];
  ansi_color_escape<char> foreground;
  ansi_color_escape<char> emphasis;
  bool has_style;
  text_style *ts_local;
  buffer<char> *buf_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_local;
  basic_string_view<char> format_str_local;
  
  emphasis.buffer[0xc] = text_style::has_emphasis(ts);
  if ((bool)emphasis.buffer[0xc]) {
    em = text_style::get_emphasis(ts);
    make_emphasis<char>((ansi_color_escape<char> *)(foreground.buffer + 0xc),em);
    pcVar2 = ansi_color_escape<char>::begin((ansi_color_escape<char> *)(foreground.buffer + 0xc));
    pcVar3 = ansi_color_escape<char>::end((ansi_color_escape<char> *)(foreground.buffer + 0xc));
    buffer<char>::append<char>(buf,pcVar2,pcVar3);
  }
  bVar1 = text_style::has_foreground(ts);
  if (bVar1) {
    emphasis.buffer[0xc] = '\x01';
    background.buffer._12_8_ = text_style::get_foreground(ts);
    make_foreground_color<char>
              ((ansi_color_escape<char> *)local_61,(color_type)background.buffer._12_8_);
    pcVar2 = ansi_color_escape<char>::begin((ansi_color_escape<char> *)local_61);
    pcVar3 = ansi_color_escape<char>::end((ansi_color_escape<char> *)local_61);
    buffer<char>::append<char>(buf,pcVar2,pcVar3);
  }
  bVar1 = text_style::has_background(ts);
  if (bVar1) {
    emphasis.buffer[0xc] = '\x01';
    local_88 = text_style::get_background(ts);
    make_background_color<char>((ansi_color_escape<char> *)local_80,local_88);
    pcVar2 = ansi_color_escape<char>::begin((ansi_color_escape<char> *)local_80);
    pcVar3 = ansi_color_escape<char>::end((ansi_color_escape<char> *)local_80);
    buffer<char>::append<char>(buf,pcVar2,pcVar3);
  }
  local_a8 = args.desc_;
  local_a0 = args.field_1;
  local_98 = format_str.data_;
  local_90 = format_str.size_;
  locale_ref::locale_ref(&local_b0);
  format_str_00.size_ = local_90;
  format_str_00.data_ = local_98;
  args_00.field_1.args_ = local_a0.args_;
  args_00.desc_ = local_a8;
  vformat_to<char>(buf,format_str_00,args_00,local_b0);
  if (emphasis.buffer[0xc] != '\0') {
    reset_color<char>(buf);
  }
  return;
}

Assistant:

void vformat_to(buffer<Char>& buf, const text_style& ts,
                basic_string_view<Char> format_str,
                basic_format_args<buffer_context<type_identity_t<Char>>> args) {
  bool has_style = false;
  if (ts.has_emphasis()) {
    has_style = true;
    auto emphasis = detail::make_emphasis<Char>(ts.get_emphasis());
    buf.append(emphasis.begin(), emphasis.end());
  }
  if (ts.has_foreground()) {
    has_style = true;
    auto foreground = detail::make_foreground_color<Char>(ts.get_foreground());
    buf.append(foreground.begin(), foreground.end());
  }
  if (ts.has_background()) {
    has_style = true;
    auto background = detail::make_background_color<Char>(ts.get_background());
    buf.append(background.begin(), background.end());
  }
  detail::vformat_to(buf, format_str, args);
  if (has_style) detail::reset_color<Char>(buf);
}